

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx2::DiscMiMBIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  byte bVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  float fVar54;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar55 [32];
  undefined1 auVar56 [64];
  float fVar63;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined8 local_220;
  undefined8 uStack_218;
  RayK<4> *local_210;
  Primitive *local_208;
  RTCFilterFunctionNArguments local_200;
  RTCHitN local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  uint local_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140 [4];
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  float local_c0 [4];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  
  pSVar7 = context->scene;
  local_140[0] = Disc->sharedGeomID;
  uVar28 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar8 = (pSVar7->geometries).items[local_140[0]].ptr;
  fVar1 = (pGVar8->time_range).lower;
  fVar12 = pGVar8->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar8->time_range).upper - fVar1));
  auVar39 = vroundss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),9);
  auVar39 = vminss_avx(auVar39,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar39 = vmaxss_avx(ZEXT816(0) << 0x20,auVar39);
  lVar35 = *(long *)&pGVar8[2].numPrimitives;
  lVar31 = (long)(int)auVar39._0_4_ * 0x38;
  lVar9 = *(long *)(lVar35 + lVar31);
  lVar10 = *(long *)(lVar35 + 0x10 + lVar31);
  uVar37 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar30 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar45._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar30);
  auVar45._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar28);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar46._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar32);
  auVar46._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar37);
  uVar36 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar33 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar29 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar47._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar29);
  auVar47._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar36);
  uVar34 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar48._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar34);
  auVar48._0_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar33);
  lVar9 = *(long *)(lVar35 + 0x38 + lVar31);
  lVar35 = *(long *)(lVar35 + 0x48 + lVar31);
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar30 * lVar35);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar28 * lVar35);
  auVar52._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar32 * lVar35);
  auVar52._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar37 * lVar35);
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar29 * lVar35);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar36 * lVar35);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar35 * uVar34);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar33 * lVar35);
  bVar6 = Disc->numPrimitives;
  auVar71._1_3_ = 0;
  auVar71[0] = bVar6;
  fVar12 = fVar12 - auVar39._0_4_;
  auVar50 = vunpcklps_avx(auVar45,auVar47);
  auVar47 = vunpckhps_avx(auVar45,auVar47);
  auVar13 = vunpcklps_avx(auVar46,auVar48);
  auVar46 = vunpckhps_avx(auVar46,auVar48);
  auVar43 = vunpcklps_avx(auVar50,auVar13);
  auVar50 = vunpckhps_avx(auVar50,auVar13);
  auVar41 = vunpcklps_avx(auVar47,auVar46);
  auVar13 = vunpcklps_avx(auVar49,auVar55);
  auVar48 = vunpckhps_avx(auVar49,auVar55);
  auVar45 = vunpcklps_avx(auVar52,auVar64);
  auVar49 = vunpckhps_avx(auVar52,auVar64);
  auVar14 = vunpcklps_avx(auVar13,auVar45);
  auVar13 = vunpckhps_avx(auVar13,auVar45);
  auVar45 = vunpcklps_avx(auVar48,auVar49);
  fVar1 = 1.0 - fVar12;
  auVar65._8_4_ = 0x3f800000;
  auVar65._0_8_ = &DAT_3f8000003f800000;
  auVar65._12_4_ = 0x3f800000;
  auVar65._16_4_ = 0x3f800000;
  auVar65._20_4_ = 0x3f800000;
  auVar65._24_4_ = 0x3f800000;
  auVar65._28_4_ = 0x3f800000;
  auVar70._4_4_ = fVar1;
  auVar70._0_4_ = fVar1;
  auVar70._8_4_ = fVar1;
  auVar70._12_4_ = fVar1;
  auVar70._16_4_ = fVar1;
  auVar70._20_4_ = fVar1;
  auVar70._24_4_ = fVar1;
  auVar70._28_4_ = fVar1;
  auVar40._0_4_ = fVar12 * auVar14._0_4_;
  auVar40._4_4_ = fVar12 * auVar14._4_4_;
  auVar40._8_4_ = fVar12 * auVar14._8_4_;
  auVar40._12_4_ = fVar12 * auVar14._12_4_;
  auVar40._16_4_ = fVar12 * auVar14._16_4_;
  auVar40._20_4_ = fVar12 * auVar14._20_4_;
  auVar40._24_4_ = fVar12 * auVar14._24_4_;
  auVar40._28_4_ = 0;
  auVar14._4_4_ = fVar12 * auVar13._4_4_;
  auVar14._0_4_ = fVar12 * auVar13._0_4_;
  auVar14._8_4_ = fVar12 * auVar13._8_4_;
  auVar14._12_4_ = fVar12 * auVar13._12_4_;
  auVar14._16_4_ = fVar12 * auVar13._16_4_;
  auVar14._20_4_ = fVar12 * auVar13._20_4_;
  auVar14._24_4_ = fVar12 * auVar13._24_4_;
  auVar14._28_4_ = auVar13._28_4_;
  auVar13._4_4_ = fVar12 * auVar45._4_4_;
  auVar13._0_4_ = fVar12 * auVar45._0_4_;
  auVar13._8_4_ = fVar12 * auVar45._8_4_;
  auVar13._12_4_ = fVar12 * auVar45._12_4_;
  auVar13._16_4_ = fVar12 * auVar45._16_4_;
  auVar13._20_4_ = fVar12 * auVar45._20_4_;
  auVar13._24_4_ = fVar12 * auVar45._24_4_;
  auVar13._28_4_ = auVar45._28_4_;
  auVar39 = vfmadd231ps_fma(auVar40,auVar70,auVar43);
  auVar15 = vfmadd231ps_fma(auVar14,auVar70,auVar50);
  auVar16 = vfmadd231ps_fma(auVar13,auVar70,auVar41);
  auVar71[4] = bVar6;
  auVar71._5_3_ = 0;
  auVar71[8] = bVar6;
  auVar71._9_3_ = 0;
  auVar71[0xc] = bVar6;
  auVar71._13_3_ = 0;
  auVar71[0x10] = bVar6;
  auVar71._17_3_ = 0;
  auVar71[0x14] = bVar6;
  auVar71._21_3_ = 0;
  auVar71[0x18] = bVar6;
  auVar71._25_3_ = 0;
  auVar71[0x1c] = bVar6;
  auVar71._29_3_ = 0;
  local_140[1] = local_140[0];
  local_140[2] = local_140[0];
  local_140[3] = local_140[0];
  uStack_130 = local_140[0];
  uStack_12c = local_140[0];
  uStack_128 = local_140[0];
  uStack_124 = local_140[0];
  uVar2 = *(undefined4 *)(ray + k * 4);
  auVar43._4_4_ = uVar2;
  auVar43._0_4_ = uVar2;
  auVar43._8_4_ = uVar2;
  auVar43._12_4_ = uVar2;
  auVar43._16_4_ = uVar2;
  auVar43._20_4_ = uVar2;
  auVar43._24_4_ = uVar2;
  auVar43._28_4_ = uVar2;
  auVar43 = vsubps_avx(ZEXT1632(auVar39),auVar43);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar41._4_4_ = uVar2;
  auVar41._0_4_ = uVar2;
  auVar41._8_4_ = uVar2;
  auVar41._12_4_ = uVar2;
  auVar41._16_4_ = uVar2;
  auVar41._20_4_ = uVar2;
  auVar41._24_4_ = uVar2;
  auVar41._28_4_ = uVar2;
  auVar41 = vsubps_avx(ZEXT1632(auVar15),auVar41);
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar72._4_4_ = uVar2;
  auVar72._0_4_ = uVar2;
  auVar72._8_4_ = uVar2;
  auVar72._12_4_ = uVar2;
  auVar72._16_4_ = uVar2;
  auVar72._20_4_ = uVar2;
  auVar72._24_4_ = uVar2;
  auVar72._28_4_ = uVar2;
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar42._4_4_ = fVar1;
  auVar42._0_4_ = fVar1;
  auVar42._8_4_ = fVar1;
  auVar42._12_4_ = fVar1;
  auVar42._16_4_ = fVar1;
  auVar42._20_4_ = fVar1;
  auVar42._24_4_ = fVar1;
  auVar42._28_4_ = fVar1;
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  auVar44._4_4_ = fVar3;
  auVar44._0_4_ = fVar3;
  auVar44._8_4_ = fVar3;
  auVar44._12_4_ = fVar3;
  auVar44._16_4_ = fVar3;
  auVar44._20_4_ = fVar3;
  auVar44._24_4_ = fVar3;
  auVar44._28_4_ = fVar3;
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar45 = vsubps_avx(ZEXT1632(auVar16),auVar72);
  auVar39 = vfmadd231ps_fma(ZEXT432((uint)(fVar4 * fVar4)),auVar44,auVar44);
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar42,auVar42);
  auVar73._0_4_ = auVar39._0_4_;
  auVar73._4_4_ = auVar73._0_4_;
  auVar73._8_4_ = auVar73._0_4_;
  auVar73._12_4_ = auVar73._0_4_;
  auVar73._16_4_ = auVar73._0_4_;
  auVar73._20_4_ = auVar73._0_4_;
  auVar73._24_4_ = auVar73._0_4_;
  auVar73._28_4_ = auVar73._0_4_;
  auVar50 = vrcpps_avx(auVar73);
  auVar14 = vpcmpgtd_avx2(auVar71,_DAT_0205a920);
  auVar39 = vfnmadd231ps_fma(auVar65,auVar50,auVar73);
  auVar39 = vfmadd132ps_fma(ZEXT1632(auVar39),auVar50,auVar50);
  fVar54 = auVar45._0_4_;
  fVar57 = auVar45._4_4_;
  auVar50._4_4_ = fVar57 * fVar4;
  auVar50._0_4_ = fVar54 * fVar4;
  fVar58 = auVar45._8_4_;
  auVar50._8_4_ = fVar58 * fVar4;
  fVar59 = auVar45._12_4_;
  auVar50._12_4_ = fVar59 * fVar4;
  fVar60 = auVar45._16_4_;
  auVar50._16_4_ = fVar60 * fVar4;
  fVar61 = auVar45._20_4_;
  auVar50._20_4_ = fVar61 * fVar4;
  fVar62 = auVar45._24_4_;
  auVar50._24_4_ = fVar62 * fVar4;
  auVar50._28_4_ = auVar73._0_4_;
  auVar15 = vfmadd231ps_fma(auVar50,auVar41,auVar44);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar43,auVar42);
  fVar63 = auVar15._0_4_ * auVar39._0_4_;
  fVar67 = auVar15._4_4_ * auVar39._4_4_;
  fVar68 = auVar15._8_4_ * auVar39._8_4_;
  fVar69 = auVar15._12_4_ * auVar39._12_4_;
  local_e0 = ZEXT1632(CONCAT412(fVar69,CONCAT48(fVar68,CONCAT44(fVar67,fVar63))));
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar74._4_4_ = uVar2;
  auVar74._0_4_ = uVar2;
  auVar74._8_4_ = uVar2;
  auVar74._12_4_ = uVar2;
  auVar74._16_4_ = uVar2;
  auVar74._20_4_ = uVar2;
  auVar74._24_4_ = uVar2;
  auVar74._28_4_ = uVar2;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar75._4_4_ = uVar2;
  auVar75._0_4_ = uVar2;
  auVar75._8_4_ = uVar2;
  auVar75._12_4_ = uVar2;
  auVar75._16_4_ = uVar2;
  auVar75._20_4_ = uVar2;
  auVar75._24_4_ = uVar2;
  auVar75._28_4_ = uVar2;
  auVar50 = vcmpps_avx(auVar74,local_e0,2);
  auVar13 = vcmpps_avx(local_e0,auVar75,2);
  auVar50 = vandps_avx(auVar13,auVar50);
  auVar13 = auVar14 & auVar50;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar50 = vandps_avx(auVar50,auVar14);
    auVar39 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
    auVar50 = vunpckhps_avx(auVar47,auVar46);
    auVar13 = vunpckhps_avx(auVar48,auVar49);
    auVar17._4_4_ = fVar12 * auVar13._4_4_;
    auVar17._0_4_ = fVar12 * auVar13._0_4_;
    auVar17._8_4_ = fVar12 * auVar13._8_4_;
    auVar17._12_4_ = fVar12 * auVar13._12_4_;
    auVar17._16_4_ = fVar12 * auVar13._16_4_;
    auVar17._20_4_ = fVar12 * auVar13._20_4_;
    auVar17._24_4_ = fVar12 * auVar13._24_4_;
    auVar17._28_4_ = auVar13._28_4_;
    auVar15 = vfmadd231ps_fma(auVar17,auVar70,auVar50);
    auVar18._4_4_ = fVar67 * fVar1;
    auVar18._0_4_ = fVar63 * fVar1;
    auVar18._8_4_ = fVar68 * fVar1;
    auVar18._12_4_ = fVar69 * fVar1;
    auVar18._16_4_ = fVar1 * 0.0;
    auVar18._20_4_ = fVar1 * 0.0;
    auVar18._24_4_ = fVar1 * 0.0;
    auVar18._28_4_ = auVar50._28_4_;
    auVar19._4_4_ = fVar67 * fVar3;
    auVar19._0_4_ = fVar63 * fVar3;
    auVar19._8_4_ = fVar68 * fVar3;
    auVar19._12_4_ = fVar69 * fVar3;
    auVar19._16_4_ = fVar3 * 0.0;
    auVar19._20_4_ = fVar3 * 0.0;
    auVar19._24_4_ = fVar3 * 0.0;
    auVar19._28_4_ = auVar48._28_4_;
    auVar20._4_4_ = fVar67 * fVar4;
    auVar20._0_4_ = fVar63 * fVar4;
    auVar20._8_4_ = fVar68 * fVar4;
    auVar20._12_4_ = fVar69 * fVar4;
    auVar20._16_4_ = fVar4 * 0.0;
    auVar20._20_4_ = fVar4 * 0.0;
    auVar20._24_4_ = fVar4 * 0.0;
    auVar20._28_4_ = auVar49._28_4_;
    auVar50 = vsubps_avx(auVar43,auVar18);
    auVar13 = vsubps_avx(auVar41,auVar19);
    auVar47 = vsubps_avx(auVar45,auVar20);
    auVar21._4_4_ = auVar47._4_4_ * auVar47._4_4_;
    auVar21._0_4_ = auVar47._0_4_ * auVar47._0_4_;
    auVar21._8_4_ = auVar47._8_4_ * auVar47._8_4_;
    auVar21._12_4_ = auVar47._12_4_ * auVar47._12_4_;
    auVar21._16_4_ = auVar47._16_4_ * auVar47._16_4_;
    auVar21._20_4_ = auVar47._20_4_ * auVar47._20_4_;
    auVar21._24_4_ = auVar47._24_4_ * auVar47._24_4_;
    auVar21._28_4_ = auVar47._28_4_;
    auVar16 = vfmadd231ps_fma(auVar21,auVar13,auVar13);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar50,auVar50);
    auVar22._28_4_ = auVar50._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(auVar15._12_4_ * auVar15._12_4_,
                            CONCAT48(auVar15._8_4_ * auVar15._8_4_,
                                     CONCAT44(auVar15._4_4_ * auVar15._4_4_,
                                              auVar15._0_4_ * auVar15._0_4_))));
    auVar50 = vcmpps_avx(ZEXT1632(auVar16),auVar22,2);
    auVar15 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
    auVar39 = vpand_avx(auVar39,auVar15);
    auVar50 = vpmovsxwd_avx2(auVar39);
    if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar50 >> 0x7f,0) != '\0') ||
          (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar50 >> 0xbf,0) != '\0') ||
        (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar50[0x1f] < '\0')
    {
      auVar23._4_4_ = fVar57 * fVar57;
      auVar23._0_4_ = fVar54 * fVar54;
      auVar23._8_4_ = fVar58 * fVar58;
      auVar23._12_4_ = fVar59 * fVar59;
      auVar23._16_4_ = fVar60 * fVar60;
      auVar23._20_4_ = fVar61 * fVar61;
      auVar23._24_4_ = fVar62 * fVar62;
      auVar23._28_4_ = auVar50._28_4_;
      auVar15 = vfmadd213ps_fma(auVar41,auVar41,auVar23);
      auVar15 = vfmadd213ps_fma(auVar43,auVar43,ZEXT1632(auVar15));
      auVar50 = vcmpps_avx(ZEXT1632(auVar15),auVar22,6);
      auVar15 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
      auVar39 = vpand_avx(auVar39,auVar15);
      auVar50 = vpmovsxwd_avx2(auVar39);
      if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar50 >> 0x7f,0) != '\0') ||
            (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar50 >> 0xbf,0) != '\0') ||
          (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar50[0x1f] < '\0') {
        local_a0._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
        local_a0._8_4_ = -fVar3;
        local_a0._12_4_ = -fVar3;
        local_a0._16_4_ = -fVar3;
        local_a0._20_4_ = -fVar3;
        local_a0._24_4_ = -fVar3;
        local_a0._28_4_ = -fVar3;
        local_80[0]._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
        local_80[0]._8_4_ = -fVar4;
        local_80[0]._12_4_ = -fVar4;
        local_80[0]._16_4_ = -fVar4;
        local_80[0]._20_4_ = -fVar4;
        local_80[0]._24_4_ = -fVar4;
        local_80[0]._28_4_ = -fVar4;
        local_100 = ZEXT1232(ZEXT812(0)) << 0x20;
        local_120 = ZEXT1232(ZEXT812(0)) << 0x20;
        local_c0[0] = -fVar1;
        local_c0[1] = -fVar1;
        local_c0[2] = -fVar1;
        local_c0[3] = -fVar1;
        fStack_b0 = -fVar1;
        fStack_ac = -fVar1;
        fStack_a8 = -fVar1;
        fStack_a4 = -fVar1;
        auVar39 = vpacksswb_avx(auVar39,auVar39);
        uVar37 = (ulong)(byte)(SUB161(auVar39 >> 7,0) & 1 | (SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                               (SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                               (SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                               (SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                               (SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                               (SUB161(auVar39 >> 0x37,0) & 1) << 6 | SUB161(auVar39 >> 0x3f,0) << 7
                              );
        lVar35 = (long)(1 << ((uint)k & 0x1f)) * 0x10;
        auVar50 = vpcmpeqd_avx2(auVar23,auVar23);
        auVar51 = ZEXT3264(auVar50);
        auVar53 = ZEXT864(0) << 0x20;
        auVar39 = vpcmpeqd_avx(auVar45._0_16_,auVar45._0_16_);
        auVar56 = ZEXT1664(auVar39);
        auVar66 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
        local_210 = ray;
        local_208 = Disc;
        do {
          local_200.hit = local_1d0;
          local_200.valid = (int *)&local_220;
          uVar28 = 0;
          for (uVar29 = uVar37; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
            uVar28 = uVar28 + 1;
          }
          local_170 = local_140[uVar28];
          pGVar8 = (pSVar7->geometries).items[local_170].ptr;
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar37 = uVar37 ^ 1L << (uVar28 & 0x3f);
            bVar38 = true;
          }
          else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                  (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            bVar38 = false;
          }
          else {
            uVar29 = (ulong)(uint)((int)uVar28 * 4);
            uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
            uVar5 = *(undefined4 *)(local_120 + uVar29);
            local_1a0._4_4_ = uVar5;
            local_1a0._0_4_ = uVar5;
            local_1a0._8_4_ = uVar5;
            local_1a0._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(local_100 + uVar29);
            local_190._4_4_ = uVar5;
            local_190._0_4_ = uVar5;
            local_190._8_4_ = uVar5;
            local_190._12_4_ = uVar5;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_e0 + uVar29);
            local_200.context = context->user;
            uVar5 = *(undefined4 *)((long)&(local_208->primIDs).field_0 + uVar29);
            local_180._4_4_ = uVar5;
            local_180._0_4_ = uVar5;
            local_180._8_4_ = uVar5;
            local_180._12_4_ = uVar5;
            uVar5 = *(undefined4 *)((long)local_c0 + uVar29);
            local_1d0._4_4_ = uVar5;
            local_1d0._0_4_ = uVar5;
            local_1d0._8_4_ = uVar5;
            local_1d0._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(local_a0 + uVar29);
            local_1c0._4_4_ = uVar5;
            local_1c0._0_4_ = uVar5;
            local_1c0._8_4_ = uVar5;
            local_1c0._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(local_80[0] + uVar29);
            local_1b0._4_4_ = uVar5;
            local_1b0._0_4_ = uVar5;
            local_1b0._8_4_ = uVar5;
            local_1b0._12_4_ = uVar5;
            uStack_15c = (local_200.context)->instID[0];
            local_160 = uStack_15c;
            uStack_158 = uStack_15c;
            uStack_154 = uStack_15c;
            uStack_150 = (local_200.context)->instPrimID[0];
            uStack_14c = uStack_150;
            uStack_148 = uStack_150;
            uStack_144 = uStack_150;
            local_220 = *(undefined8 *)(mm_lookupmask_ps + lVar35);
            uStack_218 = *(undefined8 *)(mm_lookupmask_ps + lVar35 + 8);
            local_200.geometryUserPtr = pGVar8->userPtr;
            local_200.N = 4;
            local_200.ray = (RTCRayN *)ray;
            uStack_16c = local_170;
            uStack_168 = local_170;
            uStack_164 = local_170;
            if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar50 = ZEXT1632(auVar51._0_16_);
              auVar39 = auVar56._0_16_;
              (*pGVar8->occlusionFilterN)(&local_200);
              auVar66 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar39 = vpcmpeqd_avx(auVar39,auVar39);
              auVar56 = ZEXT1664(auVar39);
              auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
              auVar51 = ZEXT3264(auVar50);
              ray = local_210;
            }
            auVar15._8_8_ = uStack_218;
            auVar15._0_8_ = local_220;
            auVar39 = auVar56._0_16_;
            if (auVar15 == (undefined1  [16])0x0) {
              auVar15 = vpcmpeqd_avx(auVar53._0_16_,(undefined1  [16])0x0);
              auVar39 = auVar39 ^ auVar15;
            }
            else {
              p_Var11 = context->args->filter;
              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                auVar50 = ZEXT1632(auVar51._0_16_);
                (*p_Var11)(&local_200);
                auVar66 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar39 = vpcmpeqd_avx(auVar39,auVar39);
                auVar56 = ZEXT1664(auVar39);
                auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
                auVar51 = ZEXT3264(auVar50);
              }
              auVar39._8_8_ = uStack_218;
              auVar39._0_8_ = local_220;
              auVar15 = vpcmpeqd_avx(auVar53._0_16_,auVar39);
              auVar39 = auVar56._0_16_ ^ auVar15;
              auVar15 = vblendvps_avx(auVar66._0_16_,*(undefined1 (*) [16])(local_200.ray + 0x80),
                                      auVar15);
              *(undefined1 (*) [16])(local_200.ray + 0x80) = auVar15;
            }
            auVar39 = vpslld_avx(auVar39,0x1f);
            bVar26 = (auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
            bVar27 = (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
            bVar25 = (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
            bVar24 = -1 < auVar39[0xf];
            bVar38 = ((bVar26 && bVar27) && bVar25) && bVar24;
            if (((bVar26 && bVar27) && bVar25) && bVar24) {
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar2;
              uVar37 = uVar37 ^ 1L << (uVar28 & 0x3f);
            }
          }
        } while ((uVar37 != 0) && (bVar38 != false));
        return (bool)(bVar38 ^ 1);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0, Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }